

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_path.cpp
# Opt level: O1

DWORD SearchPathA(LPCSTR lpPath,LPCSTR lpFileName,LPCSTR lpExtension,DWORD nBufferLength,
                 LPSTR lpBuffer,LPSTR *lpFilePart)

{
  SIZE_T *lpFileName_00;
  ulong count;
  long lVar1;
  bool bVar2;
  byte bVar3;
  DWORD nBufferLength_00;
  int iVar4;
  errno_t eVar5;
  size_t sVar6;
  char *pcVar7;
  DWORD DVar8;
  char *pcVar9;
  size_t sVar10;
  long in_FS_OFFSET;
  char *local_c0;
  undefined1 local_b8 [8];
  PathCharString CanonicalFullPathPS;
  PathCharString FullPathPS;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lpFileName_00 = &CanonicalFullPathPS.m_count;
  FullPathPS.m_size = 0;
  CanonicalFullPathPS._32_8_ = local_b8;
  CanonicalFullPathPS.m_size = 0;
  if (!PAL_InitializeChakraCoreCalled) goto LAB_003307fb;
  if (lpPath == (LPCSTR)0x0) {
    fprintf(_stderr,"] %s %s:%d","SearchPathA",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_path.cpp"
            ,0x466);
    pcVar7 = "lpPath may not be NULL\n";
LAB_003303f5:
    DVar8 = 0x57;
    fprintf(_stderr,pcVar7);
LAB_0033040b:
    nBufferLength_00 = 0;
    SetLastError(DVar8);
  }
  else {
    if (lpFileName == (LPCSTR)0x0) {
      fprintf(_stderr,"] %s %s:%d","SearchPathA",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_path.cpp"
              ,0x46c);
      pcVar7 = "lpFileName may not be NULL\n";
      goto LAB_003303f5;
    }
    if (lpExtension != (LPCSTR)0x0) {
      fprintf(_stderr,"] %s %s:%d","SearchPathA",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_path.cpp"
              ,0x472);
      DVar8 = 0x57;
      fprintf(_stderr,"lpExtension must be NULL, is %p instead\n",lpExtension);
      goto LAB_0033040b;
    }
    sVar6 = strlen(lpFileName);
    if ((*lpFileName == '/') || (*lpFileName == '\\')) {
      DVar8 = 0x57;
      if (sVar6 < 0x400) {
        StackString<32UL,_char>::Resize((StackString<32UL,_char> *)local_b8,0x400);
        DVar8 = 8;
        if (CanonicalFullPathPS._32_8_ != 0) {
          local_c0 = (char *)CanonicalFullPathPS._32_8_;
          nBufferLength_00 =
               GetFullPathNameA(lpFileName,0x401,(LPSTR)CanonicalFullPathPS._32_8_,(LPSTR *)0x0);
          if (nBufferLength_00 < CanonicalFullPathPS.m_size) {
            CanonicalFullPathPS.m_size = (ulong)nBufferLength_00;
          }
          *(undefined1 *)(CanonicalFullPathPS._32_8_ + CanonicalFullPathPS.m_size) = 0;
          if (0x401 < nBufferLength_00) {
            StackString<32UL,_char>::Resize
                      ((StackString<32UL,_char> *)local_b8,(ulong)(nBufferLength_00 - 1));
            local_c0 = (char *)CanonicalFullPathPS._32_8_;
            if (CanonicalFullPathPS._32_8_ == 0) goto LAB_0033040b;
            nBufferLength_00 =
                 GetFullPathNameA(lpFileName,nBufferLength_00,(LPSTR)CanonicalFullPathPS._32_8_,
                                  (LPSTR *)0x0);
            if (nBufferLength_00 < CanonicalFullPathPS.m_size) {
              CanonicalFullPathPS.m_size = (ulong)nBufferLength_00;
            }
            *(undefined1 *)(CanonicalFullPathPS._32_8_ + CanonicalFullPathPS.m_size) = 0;
          }
          if (nBufferLength_00 != 0) {
            iVar4 = access(local_c0,0);
            if (iVar4 != 0) {
              nBufferLength_00 = 0;
            }
            goto LAB_00330789;
          }
          if (PAL_InitializeChakraCoreCalled == false) goto LAB_003307fb;
          GetLastError();
          DVar8 = 0x57;
        }
      }
      goto LAB_0033040b;
    }
    bVar2 = true;
    if (*lpPath == '\0') {
      nBufferLength_00 = 0;
    }
    else {
      bVar3 = PAL_InitializeChakraCoreCalled;
      do {
        while( true ) {
          pcVar7 = strchr(lpPath,0x3a);
          if (pcVar7 == (char *)0x0) {
            sVar10 = strlen(lpPath);
            pcVar7 = lpPath + sVar10;
            pcVar9 = pcVar7;
          }
          else {
            pcVar9 = pcVar7 + 1;
          }
          sVar10 = (long)pcVar7 - (long)lpPath;
          count = sVar6 + 1 + sVar10;
          if (count < 0x400) break;
          if ((bVar3 & 1) == 0) goto LAB_003307fb;
LAB_00330606:
          lpPath = pcVar9;
          if (*pcVar9 == '\0') {
            nBufferLength_00 = 0;
            goto LAB_0033077c;
          }
        }
        if (pcVar7 == lpPath) goto LAB_00330606;
        StackString<32UL,_char>::Resize
                  ((StackString<32UL,_char> *)&CanonicalFullPathPS.m_count,count);
        if (lpFileName_00 == (SIZE_T *)0x0) {
          DVar8 = 8;
LAB_00330889:
          nBufferLength_00 = 0;
          SetLastError(DVar8);
          bVar2 = false;
          break;
        }
        memcpy(lpFileName_00,lpPath,sVar10);
        *(undefined1 *)((long)lpFileName_00 + sVar10) = 0x2f;
        eVar5 = strcpy_s((char *)((long)&CanonicalFullPathPS + sVar10 + 0x39),sVar6 + 1,lpFileName);
        if (eVar5 != 0) {
          DVar8 = 0xce;
          if (PAL_InitializeChakraCoreCalled != false) goto LAB_00330889;
          goto LAB_003307fb;
        }
        if (count < FullPathPS.m_size) {
          FullPathPS.m_size = count;
        }
        *(undefined1 *)((long)lpFileName_00 + FullPathPS.m_size) = 0;
        StackString<32UL,_char>::Resize((StackString<32UL,_char> *)local_b8,0x400);
        if (CanonicalFullPathPS._32_8_ == 0) {
          SetLastError(8);
          local_c0 = (char *)0x0;
          nBufferLength_00 = 0;
          bVar2 = false;
          break;
        }
        local_c0 = (char *)CanonicalFullPathPS._32_8_;
        nBufferLength_00 =
             GetFullPathNameA((LPCSTR)lpFileName_00,0x401,(LPSTR)CanonicalFullPathPS._32_8_,
                              (LPSTR *)0x0);
        if (nBufferLength_00 < CanonicalFullPathPS.m_size) {
          CanonicalFullPathPS.m_size = (ulong)nBufferLength_00;
        }
        *(undefined1 *)(CanonicalFullPathPS._32_8_ + CanonicalFullPathPS.m_size) = 0;
        if (0x401 < nBufferLength_00) {
          StackString<32UL,_char>::Resize
                    ((StackString<32UL,_char> *)local_b8,(ulong)(nBufferLength_00 - 1));
          local_c0 = (char *)CanonicalFullPathPS._32_8_;
          nBufferLength_00 =
               GetFullPathNameA((LPCSTR)lpFileName_00,nBufferLength_00,
                                (LPSTR)CanonicalFullPathPS._32_8_,(LPSTR *)0x0);
          if (nBufferLength_00 < CanonicalFullPathPS.m_size) {
            CanonicalFullPathPS.m_size = (ulong)nBufferLength_00;
          }
          *(undefined1 *)(CanonicalFullPathPS._32_8_ + CanonicalFullPathPS.m_size) = 0;
        }
        if (nBufferLength_00 == 0) {
          if (PAL_InitializeChakraCoreCalled == false) goto LAB_003307fb;
          GetLastError();
        }
        else {
          iVar4 = access(local_c0,0);
          if (iVar4 == 0) break;
        }
        nBufferLength_00 = 0;
        lpPath = pcVar9;
        bVar3 = PAL_InitializeChakraCoreCalled;
      } while (*pcVar9 != '\0');
    }
LAB_0033077c:
    if (bVar2) {
LAB_00330789:
      if (nBufferLength_00 == 0) {
        DVar8 = 2;
      }
      else {
        if (nBufferLength <= nBufferLength_00) {
          nBufferLength_00 = nBufferLength_00 + 1;
          goto LAB_00330415;
        }
        if (lpBuffer == (LPSTR)0x0) {
          DVar8 = 0x57;
        }
        else {
          eVar5 = strcpy_s(lpBuffer,(ulong)nBufferLength,local_c0);
          if (eVar5 == 0) {
            if (lpFilePart != (LPSTR *)0x0) {
              pcVar7 = strrchr(lpBuffer,0x2f);
              *lpFilePart = pcVar7;
              if (pcVar7 == (char *)0x0) {
                fprintf(_stderr,"] %s %s:%d","SearchPathA",
                        "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_path.cpp"
                        ,0x52d);
                fprintf(_stderr,"no \'/\' in full path!\n");
              }
              else {
                *lpFilePart = pcVar7 + 1;
              }
            }
            goto LAB_00330415;
          }
          DVar8 = 0xce;
        }
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_003307fb;
      }
      goto LAB_0033040b;
    }
  }
LAB_00330415:
  if (PAL_InitializeChakraCoreCalled != false) {
    StackString<32UL,_char>::~StackString((StackString<32UL,_char> *)local_b8);
    StackString<32UL,_char>::~StackString((StackString<32UL,_char> *)&CanonicalFullPathPS.m_count);
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
      __stack_chk_fail();
    }
    return nBufferLength_00;
  }
LAB_003307fb:
  abort();
}

Assistant:

DWORD
PALAPI
SearchPathA(
    IN LPCSTR lpPath,
    IN LPCSTR lpFileName,
    IN LPCSTR lpExtension,
    IN DWORD nBufferLength,
    OUT LPSTR lpBuffer,
    OUT LPSTR *lpFilePart
    )
{
    DWORD nRet = 0;
    CHAR * FullPath;
    size_t FullPathLength = 0;
    PathCharString FullPathPS;
    PathCharString CanonicalFullPathPS;
    CHAR * CanonicalFullPath;
    LPCSTR pPathStart;
    LPCSTR pPathEnd;
    size_t PathLength;
    size_t FileNameLength;
    DWORD length;
    DWORD dw;

    PERF_ENTRY(SearchPathA);
    ENTRY("SearchPathA(lpPath=%p (%s), lpFileName=%p (%s), lpExtension=%p, "
          "nBufferLength=%u, lpBuffer=%p, lpFilePart=%p)\n",
      lpPath,
      lpPath, lpFileName, lpFileName, lpExtension, nBufferLength, lpBuffer,
          lpFilePart);

    /* validate parameters */

    if(NULL == lpPath)
    {
        ASSERT("lpPath may not be NULL\n");
        SetLastError(ERROR_INVALID_PARAMETER);
        goto done;
    }
    if(NULL == lpFileName)
    {
        ASSERT("lpFileName may not be NULL\n");
        SetLastError(ERROR_INVALID_PARAMETER);
        goto done;
    }
    if(NULL != lpExtension)
    {
        ASSERT("lpExtension must be NULL, is %p instead\n", lpExtension);
        SetLastError(ERROR_INVALID_PARAMETER);
        goto done;
    }

    FileNameLength = strlen(lpFileName);

    /* special case : if file name contains absolute path, don't search the
       provided path */
    if('\\' == lpFileName[0] || '/' == lpFileName[0])
    {
        if(FileNameLength >= MAX_LONGPATH)
        {
            WARN("absolute file name <%s> is too long\n", lpFileName);
            SetLastError(ERROR_INVALID_PARAMETER);
            goto done;
        }
        /* Canonicalize the path to deal with back-to-back '/', etc. */
        length = MAX_LONGPATH;
        CanonicalFullPath = CanonicalFullPathPS.OpenStringBuffer(length);
        if (NULL == CanonicalFullPath)
        {
            SetLastError(ERROR_NOT_ENOUGH_MEMORY);
            goto done;
        }
        dw = GetFullPathNameA(lpFileName, length+1, CanonicalFullPath, NULL);
        CanonicalFullPathPS.CloseBuffer(dw);

        if (length+1 < dw)
        {
            CanonicalFullPath = CanonicalFullPathPS.OpenStringBuffer(dw-1);
            if (NULL == CanonicalFullPath)
            {
                SetLastError(ERROR_NOT_ENOUGH_MEMORY);
                goto done;
            }
            dw = GetFullPathNameA(lpFileName, dw,
                                  CanonicalFullPath, NULL);
            CanonicalFullPathPS.CloseBuffer(dw);
        }

        if (dw == 0)
        {
            WARN("couldn't canonicalize path <%s>, error is %#x. failing.\n",
                 lpFileName, GetLastError());
            SetLastError(ERROR_INVALID_PARAMETER);
            goto done;
        }

        /* see if the file exists */
        if(0 == access(CanonicalFullPath, F_OK))
        {
            /* found it */
            nRet = dw;
        }
    }
    else
    {
        LPCSTR pNextPath;

        pNextPath = lpPath;

        while (*pNextPath)
        {
            pPathStart = pNextPath;

            /* get a pointer to the end of the first path in pPathStart */
            pPathEnd = strchr(pPathStart, ':');
            if (!pPathEnd)
            {
                pPathEnd = pPathStart + strlen(pPathStart);
                /* we want to break out of the loop after this pass, so let
                   *pNextPath be '\0' */
                pNextPath = pPathEnd;
            }
            else
            {
                /* point to the next component in the path string */
                pNextPath = pPathEnd+1;
            }

            PathLength = pPathEnd-pPathStart;

            if (PathLength+FileNameLength+1 >= MAX_LONGPATH)
            {
                /* The path+'/'+file length is too long.  Skip it. */
                WARN("path component %.*s is too long, skipping it\n",
                     (int)PathLength, pPathStart);
                continue;
            }
            else if(0 == PathLength)
            {
                /* empty component : there were 2 consecutive ':' */
                continue;
            }

            /* Construct a pathname by concatenating one path from lpPath, '/'
               and lpFileName */
            FullPathLength = PathLength + FileNameLength;
            FullPath = FullPathPS.OpenStringBuffer(FullPathLength+1);
            if (NULL == FullPath)
            {
                SetLastError(ERROR_NOT_ENOUGH_MEMORY);
                goto done;
            }
            memcpy(FullPath, pPathStart, PathLength);
            FullPath[PathLength] = '/';
            if (strcpy_s(&FullPath[PathLength+1], FullPathLength+1-PathLength, lpFileName) != SAFECRT_SUCCESS)
            {
                ERROR("strcpy_s failed!\n");
                SetLastError( ERROR_FILENAME_EXCED_RANGE );
                nRet = 0;
                goto done;
            }

            FullPathPS.CloseBuffer(FullPathLength+1);
            /* Canonicalize the path to deal with back-to-back '/', etc. */
            length = MAX_LONGPATH;
            CanonicalFullPath = CanonicalFullPathPS.OpenStringBuffer(length);
            if (NULL == CanonicalFullPath)
            {
                SetLastError(ERROR_NOT_ENOUGH_MEMORY);
                goto done;
            }
            dw = GetFullPathNameA(FullPath, length+1,
                                  CanonicalFullPath, NULL);
            CanonicalFullPathPS.CloseBuffer(dw);

            if (length+1 < dw)
            {
                CanonicalFullPath = CanonicalFullPathPS.OpenStringBuffer(dw-1);
                dw = GetFullPathNameA(FullPath, dw,
                                      CanonicalFullPath, NULL);
                CanonicalFullPathPS.CloseBuffer(dw);
            }

            if (dw == 0)
            {
                /* Call failed - possibly low memory.  Skip the path */
                WARN("couldn't canonicalize path <%s>, error is %#x. "
                     "skipping it\n", FullPath, GetLastError());
                continue;
            }

            /* see if the file exists */
            if(0 == access(CanonicalFullPath, F_OK))
            {
                /* found it */
                nRet = dw;
                break;
            }
        }
    }

    if (nRet == 0)
    {
       /* file not found anywhere; say so. in Windows, this always seems to say
          FILE_NOT_FOUND, even if path doesn't exist */
       SetLastError(ERROR_FILE_NOT_FOUND);
    }
    else
    {
        if (nRet < nBufferLength)
        {
            if(NULL == lpBuffer)
            {
                /* Windows merily crashes here, but let's not */
                ERROR("caller told us buffer size was %d, but buffer is NULL\n",
                      nBufferLength);
                SetLastError(ERROR_INVALID_PARAMETER);
                nRet = 0;
                goto done;
            }

            if (strcpy_s(lpBuffer, nBufferLength, CanonicalFullPath) != SAFECRT_SUCCESS)
            {
                ERROR("strcpy_s failed!\n");
                SetLastError( ERROR_FILENAME_EXCED_RANGE );
                nRet = 0;
                goto done;
            }

            if(NULL != lpFilePart)
            {
                *lpFilePart = strrchr(lpBuffer,'/');
                if(NULL == *lpFilePart)
                {
                    ASSERT("no '/' in full path!\n");
                }
                else
                {
                    /* point to character after last '/' */
                    (*lpFilePart)++;
                }
            }
        }
        else
        {
            /* if buffer is too small, report required length, including
               terminating null */
            nRet++;
        }
    }
done:
    LOGEXIT("SearchPathA returns DWORD %u\n", nRet);
    PERF_EXIT(SearchPathA);
    return nRet;
}